

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t hufBuildDecTable(uint64_t *hcode,uint32_t im,uint32_t iM,HufDec *hdecod)

{
  int iVar1;
  uint64_t uVar2;
  int *piVar3;
  void *pvVar4;
  long lVar5;
  byte bVar6;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint64_t i_1;
  HufDec *pl_1;
  uint32_t i;
  uint32_t *p;
  HufDec *pl;
  int l;
  uint64_t c;
  size_t in_stack_ffffffffffffffa8;
  int *local_50;
  uint local_44;
  uint local_14;
  
  local_14 = in_ESI;
  do {
    if (in_EDX < local_14) {
      return 0;
    }
    uVar2 = hufCode(*(uint64_t *)(in_RDI + (ulong)local_14 * 8));
    iVar1 = hufLength(*(uint64_t *)(in_RDI + (ulong)local_14 * 8));
    bVar6 = (byte)iVar1;
    if (uVar2 >> (bVar6 & 0x3f) != 0) {
      return 0x17;
    }
    if (iVar1 < 0xf) {
      if (iVar1 != 0) {
        local_50 = (int *)(in_RCX + (uVar2 << (0xe - bVar6 & 0x3f)) * 0x10);
        for (lVar5 = (long)(1 << (0xe - bVar6 & 0x1f)); lVar5 != 0; lVar5 = lVar5 + -1) {
          if ((*local_50 != 0) || (*(long *)(local_50 + 2) != 0)) {
            return 0x17;
          }
          *local_50 = iVar1;
          local_50[1] = local_14;
          local_50 = local_50 + 4;
        }
        in_stack_ffffffffffffffa8 = 0;
      }
    }
    else {
      piVar3 = (int *)(in_RCX + (uVar2 >> (bVar6 - 0xe & 0x3f)) * 0x10);
      if (*piVar3 != 0) {
        return 0x17;
      }
      piVar3[1] = piVar3[1] + 1;
      if (*(long *)(piVar3 + 2) == 0) {
        pvVar4 = internal_exr_alloc(in_stack_ffffffffffffffa8);
        *(void **)(piVar3 + 2) = pvVar4;
      }
      else {
        lVar5 = *(long *)(piVar3 + 2);
        pvVar4 = internal_exr_alloc(in_stack_ffffffffffffffa8);
        *(void **)(piVar3 + 2) = pvVar4;
        if (*(long *)(piVar3 + 2) != 0) {
          for (local_44 = 0; local_44 < piVar3[1] - 1U; local_44 = local_44 + 1) {
            *(undefined4 *)(*(long *)(piVar3 + 2) + (ulong)local_44 * 4) =
                 *(undefined4 *)(lVar5 + (ulong)local_44 * 4);
          }
        }
        internal_exr_free((void *)0x1259de);
      }
      if (*(long *)(piVar3 + 2) == 0) {
        return 1;
      }
      *(uint *)(*(long *)(piVar3 + 2) + (ulong)(piVar3[1] - 1) * 4) = local_14;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static exr_result_t
hufBuildDecTable (
    const uint64_t* hcode, uint32_t im, uint32_t iM, HufDec* hdecod)
{
    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
        uint64_t c = hufCode (hcode[im]);
        int      l = hufLength (hcode[im]);

        if (c >> l)
        {
            //
            // Error: c is supposed to be an l-bit code,
            // but c contains a value that is greater
            // than the largest l-bit number.
            //

            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (l > HUF_DECBITS)
        {
            //
            // Long code: add a secondary entry
            //

            HufDec* pl = hdecod + (c >> (l - HUF_DECBITS));

            if (pl->len)
            {
                //
                // Error: a short code has already
                // been stored in table entry *pl.
                //

                return EXR_ERR_CORRUPT_CHUNK;
            }

            pl->lit++;

            if (pl->p)
            {
                uint32_t* p = pl->p;
                pl->p       = (uint32_t*) internal_exr_alloc (
                    sizeof (uint32_t) * pl->lit);

                if (pl->p)
                {
                    for (uint32_t i = 0; i < pl->lit - 1; ++i)
                        pl->p[i] = p[i];
                }

                internal_exr_free (p);
            }
            else { pl->p = (uint32_t*) internal_exr_alloc (sizeof (uint32_t)); }

            if (!pl->p) return EXR_ERR_OUT_OF_MEMORY;

            pl->p[pl->lit - 1] = im;
        }
        else if (l)
        {
            //
            // Short code: init all primary entries
            //

            HufDec* pl = hdecod + (c << (HUF_DECBITS - l));

            for (uint64_t i = 1 << (HUF_DECBITS - l); i > 0; i--, pl++)
            {
                if (pl->len || pl->p)
                {
                    //
                    // Error: a short code or a long code has
                    // already been stored in table entry *pl.
                    //

                    return EXR_ERR_CORRUPT_CHUNK;
                }

                pl->len = (int32_t) l;
                pl->lit = im;
            }
        }
    }
    return EXR_ERR_SUCCESS;
}